

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

void __thiscall re2::DFA::ResetCache(DFA *this,RWLocker *cache_lock)

{
  ostringstream *poVar1;
  bool bVar2;
  ostream *poVar3;
  long lVar4;
  LogMessage LStack_198;
  
  bVar2 = cache_lock->writing_;
  RWLocker::LockForWriting(cache_lock);
  if ((bVar2 == true) && (this->cache_warned_ == false)) {
    LogMessage::LogMessage
              (&LStack_198,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/dfa.cc",0x486,0
              );
    poVar1 = &LStack_198.str_;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"DFA memory cache could be too small: ",0x25);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"only room for ",0xe);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," states.",8);
    LogMessage::~LogMessage(&LStack_198);
    this->cache_warned_ = true;
  }
  lVar4 = 0xf0;
  do {
    *(undefined8 *)((long)this + lVar4 + -8) = 0;
    *(undefined4 *)((long)&this->prog_ + lVar4) = 0xffffffff;
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x170);
  ClearCache(this);
  this->mem_budget_ = this->state_budget_;
  return;
}

Assistant:

void DFA::ResetCache(RWLocker* cache_lock) {
  // Re-acquire the cache_mutex_ for writing (exclusive use).
  bool was_writing = cache_lock->IsLockedForWriting();
  cache_lock->LockForWriting();

  // If we already held cache_mutex_ for writing, it means
  // this invocation of Search() has already reset the
  // cache once already.  That's a pretty clear indication
  // that the cache is too small.  Warn about that, once.
  // TODO(rsc): Only warn if state_cache_.size() < some threshold.
  if (was_writing && !cache_warned_) {
    LOG(INFO) << "DFA memory cache could be too small: "
              << "only room for " << state_cache_.size() << " states.";
    cache_warned_ = true;
  }

  // Clear the cache, reset the memory budget.
  for (int i = 0; i < kMaxStart; i++) {
    start_[i].start = NULL;
    start_[i].firstbyte.store(kFbUnknown, std::memory_order_relaxed);
  }
  ClearCache();
  mem_budget_ = state_budget_;
}